

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O3

bool __thiscall
duckdb::Iterator::Scan
          (Iterator *this,ARTKey *upper_bound,idx_t max_count,unsafe_vector<row_t> *row_ids,
          bool equal)

{
  Node *node;
  iterator iVar1;
  uint8_t uVar2;
  bool bVar3;
  ulong uVar4;
  InternalException *this_00;
  uint uVar5;
  uint8_t byte;
  ARTKey key;
  uint8_t local_65;
  uint local_64;
  ARTKey *local_60;
  string local_58;
  ulong local_38;
  
  node = &this->last_leaf;
  local_64 = (uint)equal;
  local_60 = upper_bound;
  do {
    if ((local_60->len != 0) &&
       (((this->status == GATE_NOT_SET || (this->entered_nested_leaf == true)) &&
        (bVar3 = IteratorKey::GreaterThan
                           (&this->current_key,local_60,SUB41(local_64,0),this->nested_depth), bVar3
        )))) {
      return true;
    }
    uVar4 = (node->super_IndexPointer).data;
    uVar5 = (byte)(uVar4 >> 0x38) & 0x7f;
    if (uVar5 - 8 < 3) {
      local_65 = '\0';
      while (bVar3 = Node::GetNextByte(node,this->art,&local_65), uVar2 = local_65, bVar3) {
        if (max_count <
            ((long)(row_ids->super_vector<long,_std::allocator<long>_>).
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_finish -
             (long)(row_ids->super_vector<long,_std::allocator<long>_>).
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start >> 3) + 1U) {
          return false;
        }
        this->row_id[7] = local_65;
        ARTKey::ARTKey((ARTKey *)&local_58,this->row_id,8);
        uVar4 = *(ulong *)local_58._M_string_length ^ 0x80;
        local_38 = *(ulong *)local_58._M_string_length >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28
                   | (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                   (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
                   | uVar4 << 0x38;
        iVar1._M_current =
             (row_ids->super_vector<long,_std::allocator<long>_>).
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar1._M_current ==
            (row_ids->super_vector<long,_std::allocator<long>_>).
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          ::std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&row_ids->super_vector<long,_std::allocator<long>_>,iVar1,(long *)&local_38);
        }
        else {
          *iVar1._M_current = local_38;
          (row_ids->super_vector<long,_std::allocator<long>_>).
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
               = iVar1._M_current + 1;
        }
        if (uVar2 == 0xff) break;
        local_65 = uVar2 + '\x01';
      }
    }
    else if (uVar5 == 2) {
      bVar3 = Leaf::DeprecatedGetRowIds(this->art,node,row_ids,max_count);
      if (!bVar3) {
        return false;
      }
    }
    else {
      if (uVar5 != 7) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Invalid leaf type for index scan.","");
        InternalException::InternalException(this_00,&local_58);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar1._M_current =
           (row_ids->super_vector<long,_std::allocator<long>_>).
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      if (max_count <
          ((long)iVar1._M_current -
           (long)(row_ids->super_vector<long,_std::allocator<long>_>).
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start >> 3) + 1U) {
        return false;
      }
      local_58._M_dataplus._M_p = (pointer)(uVar4 & 0xffffffffffffff);
      if (iVar1._M_current ==
          (row_ids->super_vector<long,_std::allocator<long>_>).
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&row_ids->super_vector<long,_std::allocator<long>_>,iVar1,(long *)&local_58);
      }
      else {
        *iVar1._M_current = (long)local_58._M_dataplus._M_p;
        (row_ids->super_vector<long,_std::allocator<long>_>).
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar1._M_current + 1;
      }
    }
    this->entered_nested_leaf = false;
    bVar3 = Next(this);
    if (!bVar3) {
      return true;
    }
  } while( true );
}

Assistant:

bool Iterator::Scan(const ARTKey &upper_bound, const idx_t max_count, unsafe_vector<row_t> &row_ids, const bool equal) {
	bool has_next;
	do {
		// An empty upper bound indicates that no upper bound exists.
		if (!upper_bound.Empty()) {
			if (status == GateStatus::GATE_NOT_SET || entered_nested_leaf) {
				if (current_key.GreaterThan(upper_bound, equal, nested_depth)) {
					return true;
				}
			}
		}

		switch (last_leaf.GetType()) {
		case NType::LEAF_INLINED:
			if (row_ids.size() + 1 > max_count) {
				return false;
			}
			row_ids.push_back(last_leaf.GetRowId());
			break;
		case NType::LEAF:
			if (!Leaf::DeprecatedGetRowIds(art, last_leaf, row_ids, max_count)) {
				return false;
			}
			break;
		case NType::NODE_7_LEAF:
		case NType::NODE_15_LEAF:
		case NType::NODE_256_LEAF: {
			uint8_t byte = 0;
			while (last_leaf.GetNextByte(art, byte)) {
				if (row_ids.size() + 1 > max_count) {
					return false;
				}
				row_id[ROW_ID_SIZE - 1] = byte;
				ARTKey key(&row_id[0], ROW_ID_SIZE);
				row_ids.push_back(key.GetRowId());
				if (byte == NumericLimits<uint8_t>::Maximum()) {
					break;
				}
				byte++;
			}
			break;
		}
		default:
			throw InternalException("Invalid leaf type for index scan.");
		}

		entered_nested_leaf = false;
		has_next = Next();
	} while (has_next);
	return true;
}